

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O0

Result_t * Kumu::Result_t::Delete(Result_t *__return_storage_ptr__,int v)

{
  uint uVar1;
  undefined4 uVar2;
  ILogSink *this;
  uint local_24;
  ui32_t i;
  AutoMutex L;
  int v_local;
  
  L.m_Mutex._4_4_ = v;
  if ((v < -99) || (99 < v)) {
    this = DefaultLogSink();
    ILogSink::Error(this,"Cannot delete core result code: %ld\n",(ulong)L.m_Mutex._4_4_);
    Result_t(__return_storage_ptr__,(Result_t *)RESULT_FAIL);
    return __return_storage_ptr__;
  }
  if (s_MapLock == (Mutex *)0x0) {
    __assert_fail("s_MapLock",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                  ,99,"static Kumu::Result_t Kumu::Result_t::Delete(int)");
  }
  AutoMutex::AutoMutex((AutoMutex *)&stack0xffffffffffffffe0,s_MapLock);
  for (local_24 = 0; local_24 < s_MapSize; local_24 = local_24 + 1) {
    uVar1 = local_24;
    if (s_ResultMap[local_24].rcode == L.m_Mutex._4_4_) goto LAB_0012c9ac;
  }
  Result_t(__return_storage_ptr__,(Result_t *)RESULT_FALSE);
LAB_0012ca62:
  AutoMutex::~AutoMutex((AutoMutex *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
LAB_0012c9ac:
  while (local_24 = uVar1 + 1, local_24 < s_MapSize) {
    uVar2 = *(undefined4 *)&s_ResultMap[local_24].field_0x4;
    s_ResultMap[uVar1].rcode = s_ResultMap[local_24].rcode;
    *(undefined4 *)&s_ResultMap[uVar1].field_0x4 = uVar2;
    s_ResultMap[uVar1].result = s_ResultMap[local_24].result;
    uVar1 = local_24;
  }
  s_MapSize = s_MapSize - 1;
  Result_t(__return_storage_ptr__,(Result_t *)RESULT_OK);
  goto LAB_0012ca62;
}

Assistant:

Kumu::Result_t
Kumu::Result_t::Delete(int v)
{
  if ( v < -99 || v > 99 )
    {
      DefaultLogSink().Error("Cannot delete core result code: %ld\n", v);
      return RESULT_FAIL;
    }

  assert(s_MapLock);
  AutoMutex L(*s_MapLock);

  for ( ui32_t i = 0; i < s_MapSize; ++i )
    {
      if ( s_ResultMap[i].rcode == v )
	{
	  for ( ++i; i < s_MapSize; ++i )
	    s_ResultMap[i-1] = s_ResultMap[i];

	  --s_MapSize;
	  return RESULT_OK;
	}
    }

  return RESULT_FALSE;
}